

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O2

MidiEvent * __thiscall smf::MidiEvent::operator=(MidiEvent *this,MidiMessage *message)

{
  pointer puVar1;
  int i;
  long lVar2;
  
  if (this != (MidiEvent *)message) {
    this->m_eventlink = (MidiEvent *)0x0;
    this->seq = 0;
    this->tick = 0;
    this->track = 0;
    this->seconds = 0.0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (long)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    for (lVar2 = 0;
        puVar1 = (this->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar2 < *(int *)&(this->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (int)puVar1; lVar2 = lVar2 + 1) {
      puVar1[lVar2] =
           (message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
    }
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const MidiMessage& message) {
	if (this == &message) {
		return *this;
	}
	clearVariables();
	this->resize(message.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = message[i];
	}
	return *this;
}